

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

int __thiscall
CServerBrowserFilter::AddFilter(CServerBrowserFilter *this,CServerFilterInfo *pFilterInfo)

{
  int iVar1;
  int iVar2;
  CServerFilterInfo *in_RDI;
  long in_FS_OFFSET;
  CServerFilter Filter;
  CServerFilter *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  CServerFilterInfo *in_stack_fffffffffffffef0;
  CServerFilter local_f0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CServerFilter::CServerFilter(&local_f0);
  CServerFilterInfo::Set(in_stack_fffffffffffffef0,in_RDI);
  local_f0.m_pSortedServerlist = (int *)0x0;
  local_f0.m_NumSortedPlayers = 0;
  local_f0.m_NumSortedServers = 0;
  local_f0.m_SortedServersCapacity = 0;
  array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
  ::add((array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
         *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
  iVar1 = array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
          ::size((array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
                  *)in_RDI->m_aGametypeExclusive);
  iVar2 = iVar1 + -1;
  CServerFilter::~CServerFilter((CServerFilter *)CONCAT44(iVar1,iVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CServerBrowserFilter::AddFilter(const CServerFilterInfo *pFilterInfo)
{
	CServerFilter Filter;
	Filter.m_FilterInfo.Set(pFilterInfo);
	Filter.m_pSortedServerlist = 0;
	Filter.m_NumSortedPlayers = 0;
	Filter.m_NumSortedServers = 0;
	Filter.m_SortedServersCapacity = 0;
	Filter.m_pServerBrowserFilter = this;
	m_lFilters.add(Filter);

	return m_lFilters.size()-1;
}